

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo.cpp
# Opt level: O1

int __thiscall CDemoPlayer::SetPos(CDemoPlayer *this,int WantedTick)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  long lVar10;
  int *piVar11;
  int iVar12;
  
  if (this->m_File == (IOHANDLE)0x0) {
    iVar8 = -1;
  }
  else {
    iVar8 = (this->m_Info).m_Info.m_FirstTick;
    iVar5 = (this->m_Info).m_Info.m_LastTick;
    iVar12 = iVar5;
    if (WantedTick < iVar5) {
      iVar12 = WantedTick;
    }
    if (WantedTick < iVar8) {
      iVar12 = iVar8;
    }
    iVar4 = iVar12 + -5;
    iVar1 = (this->m_Info).m_SeekablePoints;
    uVar9 = (uint)((float)iVar1 * ((float)(iVar4 - iVar8) / (float)(iVar5 - iVar8)));
    uVar7 = iVar1 - 1;
    uVar2 = uVar7;
    if ((int)uVar9 < (int)uVar7) {
      uVar2 = uVar9;
    }
    uVar3 = 0;
    if (-1 < (int)uVar9) {
      uVar3 = uVar2;
    }
    uVar6 = (ulong)uVar3;
    if ((int)uVar3 < (int)uVar7) {
      piVar11 = &this->m_pKeyFrames[(int)uVar3].m_Tick;
      lVar10 = 0;
      do {
        if (iVar4 <= *piVar11) {
          uVar6 = (ulong)(uVar3 - (int)lVar10);
          goto LAB_001c2161;
        }
        lVar10 = lVar10 + -1;
        piVar11 = piVar11 + 4;
      } while (((long)(int)uVar3 - (long)iVar1) + 1 != lVar10);
      uVar6 = (ulong)uVar7;
    }
LAB_001c2161:
    iVar5 = (int)uVar6;
    if (0 < iVar5) {
      do {
        iVar5 = (int)uVar6;
        if (this->m_pKeyFrames[uVar6].m_Tick <= iVar4) goto LAB_001c2184;
        uVar6 = (ulong)(iVar5 - 1);
      } while (1 < iVar5);
      iVar5 = 0;
    }
LAB_001c2184:
    iVar8 = 0;
    io_seek(this->m_File,(int)this->m_pKeyFrames[iVar5].m_Filepos,0);
    (this->m_Info).m_NextTick = -1;
    (this->m_Info).m_PreviousTick = -1;
    (this->m_Info).m_Info.m_CurrentTick = -1;
    if (-1 < iVar12) {
      do {
        DoTick(this);
      } while ((this->m_Info).m_NextTick < iVar12);
    }
    Play(this);
  }
  return iVar8;
}

Assistant:

int CDemoPlayer::SetPos(int WantedTick)
{
	if(!m_File)
		return -1;

	WantedTick = clamp(WantedTick, m_Info.m_Info.m_FirstTick, m_Info.m_Info.m_LastTick);
	int KeyframeWantedTick = WantedTick - 5; // -5 because we have to have a current tick and previous tick when we do the playback
	const float Percent = (KeyframeWantedTick - m_Info.m_Info.m_FirstTick) / float(m_Info.m_Info.m_LastTick - m_Info.m_Info.m_FirstTick);

	// get correct key frame
	int Keyframe = clamp((int)(m_Info.m_SeekablePoints*Percent), 0, m_Info.m_SeekablePoints-1);
	while(Keyframe < m_Info.m_SeekablePoints-1 && m_pKeyFrames[Keyframe].m_Tick < KeyframeWantedTick)
		Keyframe++;
	while(Keyframe > 0 && m_pKeyFrames[Keyframe].m_Tick > KeyframeWantedTick)
		Keyframe--;

	// seek to the correct keyframe
	io_seek(m_File, m_pKeyFrames[Keyframe].m_Filepos, IOSEEK_START);

	m_Info.m_NextTick = -1;
	m_Info.m_Info.m_CurrentTick = -1;
	m_Info.m_PreviousTick = -1;

	// playback everything until we hit our tick
	while(m_Info.m_NextTick < WantedTick)
		DoTick();

	Play();

	return 0;
}